

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.h
# Opt level: O2

void __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::~AffixTokenMatcherWarehouse
          (AffixTokenMatcherWarehouse *this)

{
  CodePointMatcherWarehouse::~CodePointMatcherWarehouse(&this->fCodePoints);
  CombinedCurrencyMatcher::~CombinedCurrencyMatcher(&this->fCurrency);
  SymbolMatcher::~SymbolMatcher(&(this->fPermille).super_SymbolMatcher);
  SymbolMatcher::~SymbolMatcher(&(this->fPercent).super_SymbolMatcher);
  SymbolMatcher::~SymbolMatcher(&(this->fPlusSign).super_SymbolMatcher);
  SymbolMatcher::~SymbolMatcher(&(this->fMinusSign).super_SymbolMatcher);
  return;
}

Assistant:

class U_I18N_API AffixTokenMatcherWarehouse : public UMemory {
  public:
    AffixTokenMatcherWarehouse() = default;  // WARNING: Leaves the object in an unusable state

    AffixTokenMatcherWarehouse(const AffixTokenMatcherSetupData* setupData);

    NumberParseMatcher& minusSign();

    NumberParseMatcher& plusSign();

    NumberParseMatcher& percent();

    NumberParseMatcher& permille();

    NumberParseMatcher& currency(UErrorCode& status);

    IgnorablesMatcher& ignorables();

    NumberParseMatcher& nextCodePointMatcher(UChar32 cp);

  private:
    // NOTE: The following field may be unsafe to access after construction is done!
    const AffixTokenMatcherSetupData* fSetupData;

    // NOTE: These are default-constructed and should not be used until initialized.
    MinusSignMatcher fMinusSign;
    PlusSignMatcher fPlusSign;
    PercentMatcher fPercent;
    PermilleMatcher fPermille;
    CombinedCurrencyMatcher fCurrency;

    // Use a child class for code point matchers, since it requires non-default operators.
    CodePointMatcherWarehouse fCodePoints;

    friend class AffixPatternMatcherBuilder;
    friend class AffixPatternMatcher;
}